

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

Vec_Int_t * Ree_ManComputeCuts(Gia_Man_t *p,Vec_Int_t **pvXors,int fVerbose)

{
  int iVar1;
  int iVar2;
  int Entry;
  uint uVar3;
  Hash_IntMan_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *pVVar4;
  Vec_Int_t *vData;
  Vec_Int_t *p_03;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  int *pList0;
  int *pList1;
  int fVerbose_00;
  ulong uVar7;
  int i;
  
  p_00 = (Hash_IntMan_t *)calloc(1,0x18);
  iVar1 = Abc_PrimeCudd(0x44c);
  p_01 = Vec_IntStart(iVar1);
  p_00->vTable = p_01;
  p_02 = Vec_IntAlloc(0x1130);
  p_00->vObjs = p_02;
  Vec_IntFill(p_02,4,0);
  p_00->nRefs = 1;
  pVVar4 = Vec_IntAlloc(1000);
  vData = Vec_IntAlloc(1000);
  iVar1 = Gia_ManAndNum(p);
  p_03 = Vec_IntAlloc(iVar1 * 0x1e);
  Vec_IntFill(p_03,p->nObjs,0);
  Gia_ManCleanValue(p);
  for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p->vCis,iVar1);
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pGVar5);
    Vec_IntWriteEntry(p_03,iVar2,p_03->nSize);
    Vec_IntPush(p_03,1);
    Vec_IntPush(p_03,1);
    iVar2 = Gia_ObjId(p,pGVar5);
    Vec_IntPush(p_03,iVar2);
    Vec_IntPush(p_03,0xaa);
  }
  if (pvXors != (Vec_Int_t **)0x0) {
    pVVar6 = Vec_IntAlloc(1000);
    *pvXors = pVVar6;
  }
  uVar7 = 0;
  for (iVar1 = 0; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManObj(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(undefined8 *)pGVar5;
    if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
      iVar2 = Vec_IntEntry(p_03,iVar1 - (uVar3 & 0x1fffffff));
      pList0 = Vec_IntEntryP(p_03,iVar2);
      iVar2 = Vec_IntEntry(p_03,iVar1 - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff));
      pList1 = Vec_IntEntryP(p_03,iVar2);
      if (pvXors == (Vec_Int_t **)0x0) {
        pVVar6 = (Vec_Int_t *)0x0;
      }
      else {
        pVVar6 = *pvXors;
      }
      Ree_ManCutMerge(p,iVar1,pList0,pList1,pVVar4,p_00,vData,pVVar6);
      Vec_IntWriteEntry(p_03,iVar1,p_03->nSize);
      i = 0;
      iVar2 = pVVar4->nSize;
      if (pVVar4->nSize < 1) {
        iVar2 = i;
      }
      for (; iVar2 != i; i = i + 1) {
        Entry = Vec_IntEntry(pVVar4,i);
        Vec_IntPush(p_03,Entry);
      }
      iVar2 = Vec_IntEntry(pVVar4,0);
      uVar7 = (ulong)(uint)((int)uVar7 + iVar2);
    }
  }
  if (fVerbose != 0) {
    uVar3 = Gia_ManAndNum(p);
    printf("AIG nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n",
           (double)(int)uVar7 / (double)(int)uVar3,(double)p_03->nSize / (double)(int)uVar3,
           (ulong)uVar3,uVar7);
  }
  Vec_IntFree(pVVar4);
  Vec_IntFree(p_03);
  pVVar4 = Ree_ManDeriveAdds(p_00,vData,fVerbose_00);
  iVar1 = pVVar4->nSize;
  uVar7 = (long)iVar1 / 6;
  qsort(pVVar4->pArray,(long)(int)uVar7,0x18,Ree_ManCompare);
  if (fVerbose != 0) {
    printf("Adders = %d.  Total cuts = %d.  Hashed cuts = %d.  Hashed/Adders = %.2f.\n",
           ((double)(p_02->nSize / 4 + -1) * 6.0) / (double)iVar1,uVar7 & 0xffffffff,
           (long)vData->nSize / 3 & 0xffffffff);
  }
  Vec_IntFree(vData);
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  free(p_00);
  Ree_ManRemoveTrivial(p,pVVar4);
  Ree_ManRemoveContained(p,pVVar4);
  return pVVar4;
}

Assistant:

Vec_Int_t * Ree_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvXors, int fVerbose )
{
    extern void Ree_ManRemoveTrivial( Gia_Man_t * p, Vec_Int_t * vAdds );
    extern void Ree_ManRemoveContained( Gia_Man_t * p, Vec_Int_t * vAdds );
    Gia_Obj_t * pObj; 
    int * pList0, * pList1, i, nCuts = 0;
    Hash_IntMan_t * pHash = Hash_IntManStart( 1000 );
    Vec_Int_t * vAdds;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vData = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManCleanValue( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        Vec_IntWriteEntry( vCuts, Gia_ObjId(p, pObj), Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, Gia_ObjId(p, pObj) );
        Vec_IntPush( vCuts, 0xAA );
    }
    if ( pvXors ) *pvXors = Vec_IntAlloc( 1000 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pList0 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId0(pObj, i)) );
        pList1 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId1(pObj, i)) );
        Ree_ManCutMerge( p, i, pList0, pList1, vTemp, pHash, vData, pvXors ? *pvXors : NULL );
        Vec_IntWriteEntry( vCuts, i, Vec_IntSize(vCuts) );
        Vec_IntAppend( vCuts, vTemp );
        nCuts += Vec_IntEntry( vTemp, 0 );
    }
    if ( fVerbose )
        printf( "AIG nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 1.0*Vec_IntSize(vCuts)/Gia_ManAndNum(p) );
    Vec_IntFree( vTemp );
    Vec_IntFree( vCuts );
    vAdds = Ree_ManDeriveAdds( pHash, vData, fVerbose );
    qsort( Vec_IntArray(vAdds), (size_t)(Vec_IntSize(vAdds)/6), 24, (int (*)(const void *, const void *))Ree_ManCompare );
    if ( fVerbose )
        printf( "Adders = %d.  Total cuts = %d.  Hashed cuts = %d.  Hashed/Adders = %.2f.\n", 
            Vec_IntSize(vAdds)/6, Vec_IntSize(vData)/3, Hash_IntManEntryNum(pHash), 6.0*Hash_IntManEntryNum(pHash)/Vec_IntSize(vAdds) );
    Vec_IntFree( vData );
    Hash_IntManStop( pHash );
    Ree_ManRemoveTrivial( p, vAdds );
    Ree_ManRemoveContained( p, vAdds );
    //Ree_ManPrintAdders( vAdds, 1 );
    return vAdds;
}